

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O2

Graph * GraphBase::load_graph
                  (Graph *__return_storage_ptr__,string *graphName,bool isReverse,string *probDist,
                  float probEdge)

{
  pointer pvVar1;
  pointer ppVar2;
  int iVar3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  time_t tVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer ppVar7;
  Graph *__range3;
  long lVar8;
  long lVar9;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_4;
  undefined1 auVar10 [16];
  allocator_type local_79;
  pointer local_78;
  Graph *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecInDeg;
  string local_50;
  
  local_78 = (pointer)CONCAT44(local_78._4_4_,probEdge);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_50,(string *)graphName);
  IOcontroller::load_graph_struct(&local_50,__return_storage_ptr__,isReverse);
  std::__cxx11::string::~string((string *)&local_50);
  iVar3 = tolower((int)*(probDist->_M_dataplus)._M_p);
  if (iVar3 == 0x74) {
    dsfmt_chk_init_gen_rand(&dsfmt_global_data,0,0x4de1);
    local_78 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = __return_storage_ptr__;
    for (pvVar5 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar5 != local_78;
        pvVar5 = pvVar5 + 1) {
      ppVar2 = (pvVar5->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar7 = (pvVar5->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
          ppVar7 = ppVar7 + 1) {
        if (0x17d < dsfmt_global_data.idx) {
          dsfmt_gen_rand_all(&dsfmt_global_data);
          dsfmt_global_data.idx = 0;
        }
        lVar8 = (long)dsfmt_global_data.idx;
        dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
        ppVar7->second =
             *(float *)(&DAT_001263ac +
                       ((ulong)*(uint *)((long)dsfmt_global_data.status + lVar8 * 8) % 3) * 4);
      }
    }
    tVar4 = time((time_t *)0x0);
    dsfmt_chk_init_gen_rand(&dsfmt_global_data,(uint32_t)tVar4,0x4de1);
    __return_storage_ptr__ = local_70;
  }
  else if (iVar3 == 0x75) {
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
      ppVar2 = (pvVar5->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar7 = (pvVar5->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
          ppVar7 = ppVar7 + 1) {
        ppVar7->second = local_78._0_4_;
      }
    }
  }
  else if (iVar3 == 0x77) {
    if (isReverse) {
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar5 = (__return_storage_ptr__->
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1;
          pvVar5 = pvVar5 + 1) {
        ppVar7 = (pvVar5->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (pvVar5->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar8 = (long)ppVar2 - (long)ppVar7;
        lVar9 = lVar8 >> 3;
        auVar10._8_4_ = (int)(lVar8 >> 0x23);
        auVar10._0_8_ = lVar9;
        auVar10._12_4_ = 0x45300000;
        for (; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1) {
          ppVar7->second =
               (float)(1.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)));
        }
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&vecInDeg,
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x18,&local_79);
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pvVar5 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (pvVar6 = pvVar5; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1) {
        ppVar2 = (pvVar6->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar7 = (pvVar6->
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
            ppVar7 = ppVar7 + 1) {
          vecInDeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[ppVar7->first] =
               vecInDeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[ppVar7->first] + 1;
        }
      }
      for (; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
        ppVar2 = (pvVar5->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar7 = (pvVar5->
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
            ppVar7 = ppVar7 + 1) {
          ppVar7->second =
               1.0 / (float)vecInDeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[ppVar7->first];
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&vecInDeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Graph load_graph(const std::string graphName, const bool isReverse, const std::string probDist = "load",
                            const float probEdge = float(0.1))
    {
        Graph graph;
        TIO::load_graph_struct(graphName, graph, isReverse);

        // Default is to load the edge including the diffusion probability from the file.
        // The following changes the setting of diffusion probability.
        if (tolower(probDist[0]) == 'w')
        {
            // Weighted cascade
            if (isReverse)
            {
                // Reverse graph
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = float(1.0 / nbrs.size());
                    }
                }
            }
            else
            {
                // Forward graph
                std::vector<uint32_t> vecInDeg(graph.size());
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        vecInDeg[nbr.first]++;
                    }
                }
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = (float)1.0 / vecInDeg[nbr.first];
                    }
                }
            }

        }
        else if (tolower(probDist[0]) == 't')
        {
            // Trivalency cascade
            dsfmt_gv_init_gen_rand(0);
            float pProb[3] = {float(0.001), float(0.01), float(0.1)};
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = pProb[dsfmt_gv_genrand_uint32_range(3)];
                }
            }
            dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
        }
        else if (tolower(probDist[0]) == 'u')
        {
            // Uniform probability
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = probEdge;
                }
            }
        }
        return graph;
    }